

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * __thiscall FSerializer::StringPtr(FSerializer *this,char *key,char **charptr)

{
  Value *this_00;
  Ch *cc;
  char *pcVar1;
  
  if (this->w == (FWriter *)0x0) {
    this_00 = FReader::FindKey(this->r,key);
    if (this_00 != (Value *)0x0) {
      if ((*(byte *)((long)&this_00->data_ + 0x17) & 4) == 0) {
        *charptr = (char *)0x0;
      }
      else {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
        pcVar1 = UnicodeToString(cc);
        *charptr = pcVar1;
      }
    }
  }
  else {
    WriteKey(this,key);
    if (*charptr == (char *)0x0) {
      FWriter::Null(this->w);
    }
    else {
      FWriter::String(this->w,*charptr);
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::StringPtr(const char *key, const char *&charptr)
{
	if (isWriting())
	{
		WriteKey(key);
		if (charptr != nullptr)
			w->String(charptr);
		else
			w->Null();
	}
	else
	{
		auto val = r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsString())
			{
				charptr = UnicodeToString(val->GetString());
			}
			else
			{
				charptr = nullptr;
			}
		}
	}
	return *this;
}